

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cc
# Opt level: O0

shared_ptr<pstack::Dwarf::Info> __thiscall pstack::Context::getDwarf(Context *this,string *filename)

{
  bool in_DL;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<pstack::Dwarf::Info> sVar1;
  string *filename_local;
  Context *this_local;
  
  filename_local = filename;
  this_local = this;
  getImageForName((Context *)&stack0xffffffffffffffd0,filename,in_DL);
  getDwarf(this,(sptr *)filename);
  std::shared_ptr<pstack::Elf::Object>::~shared_ptr
            ((shared_ptr<pstack::Elf::Object> *)&stack0xffffffffffffffd0);
  sVar1.super___shared_ptr<pstack::Dwarf::Info,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<pstack::Dwarf::Info,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<pstack::Dwarf::Info>)
         sVar1.super___shared_ptr<pstack::Dwarf::Info,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Dwarf::Info>
Context::getDwarf(const std::string &filename)
{
    return getDwarf(getImageForName(filename));
}